

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<unsigned_int>
kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>::
Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_>::apply
          (ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_> *subParser,ParserInput *input)

{
  byte *pbVar1;
  int iVar2;
  NullableValue<unsigned_int> in_RDI;
  byte *pbVar3;
  byte *pbVar4;
  
  pbVar3 = (byte *)(input->super_IteratorInput<char,_const_char_*>).pos;
  pbVar1 = (byte *)(input->super_IteratorInput<char,_const_char_*>).end;
  if (pbVar3 == pbVar1) {
    iVar2 = 0;
  }
  else {
    pbVar4 = (byte *)(input->super_IteratorInput<char,_const_char_*>).best;
    iVar2 = 0;
    do {
      if (((subParser->subParser).bits[*pbVar3 >> 6] >> ((ulong)*pbVar3 & 0x3f) & 1) == 0) {
        if (pbVar4 < pbVar3) {
          pbVar4 = pbVar3;
        }
        (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar4;
        break;
      }
      pbVar3 = pbVar3 + 1;
      iVar2 = iVar2 + 1;
      if (pbVar4 < pbVar3) {
        pbVar4 = pbVar3;
      }
      (input->super_IteratorInput<char,_const_char_*>).pos = (char *)pbVar3;
      (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar4;
    } while (pbVar3 != pbVar1);
  }
  *(undefined1 *)in_RDI = 1;
  *(int *)((long)in_RDI + 4) = iVar2;
  return (Maybe<unsigned_int>)in_RDI;
}

Assistant:

static Maybe<uint> apply(const SubParser& subParser, Input& input) {
    uint count = 0;

    while (!input.atEnd()) {
      Input subInput(input);

      if (kj::none != subParser(subInput)) {
        subInput.advanceParent();
        ++count;
      } else {
        break;
      }
    }

    if (atLeastOne && count == 0) {
      return kj::none;
    }

    return count;
  }